

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinAnalytic_fp.c
# Opt level: O1

void InputHelp(void)

{
  putchar(10);
  puts(" Command line options:");
  puts("   --tol        : nonlinear solver tolerance");
  puts("   --maxiter    : max number of nonlinear iterations");
  puts("   --m_aa       : number of Anderson acceleration vectors");
  puts("   --delay_aa   : Anderson acceleration delay");
  puts("   --damping_fp : fixed point damping parameter");
  puts("   --damping_aa : Anderson acceleration damping parameter");
  puts("   --orth_aa    : Anderson acceleration orthogonalization method");
  puts("   --damping_fn : user defined damping function");
  puts("   --depth_fn   : user defined depth function");
  return;
}

Assistant:

static void InputHelp(void)
{
  printf("\n");
  printf(" Command line options:\n");
  printf("   --tol        : nonlinear solver tolerance\n");
  printf("   --maxiter    : max number of nonlinear iterations\n");
  printf("   --m_aa       : number of Anderson acceleration vectors\n");
  printf("   --delay_aa   : Anderson acceleration delay\n");
  printf("   --damping_fp : fixed point damping parameter\n");
  printf("   --damping_aa : Anderson acceleration damping parameter\n");
  printf("   --orth_aa    : Anderson acceleration orthogonalization method\n");
  printf("   --damping_fn : user defined damping function\n");
  printf("   --depth_fn   : user defined depth function\n");

  return;
}